

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modulo.h
# Opt level: O0

ptr<Value> __thiscall Modulo::asIntegers(Modulo *this,longlong leftOperand,longlong rightOperand)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  shared_ptr<Integer> local_38;
  longlong rightOperand_local;
  longlong leftOperand_local;
  Modulo *this_local;
  
  rightOperand_local = rightOperand;
  leftOperand_local = leftOperand;
  this_local = this;
  make<Integer,long_long>((longlong *)&local_38);
  std::shared_ptr<Value>::shared_ptr<Integer,void>((shared_ptr<Value> *)this,&local_38);
  std::shared_ptr<Integer>::~shared_ptr(&local_38);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asIntegers(long long leftOperand, long long rightOperand) override {
        return make<Integer>(leftOperand % rightOperand);
    }